

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeOperations.cpp
# Opt level: O0

ModuleDeclaration * __thiscall
soul::SourceCodeOperations::findDeclaration(SourceCodeOperations *this,ModuleBase *target)

{
  bool bVar1;
  reference pMVar2;
  ModuleDeclaration *m;
  iterator __end1;
  iterator __begin1;
  vector<soul::SourceCodeOperations::ModuleDeclaration,_std::allocator<soul::SourceCodeOperations::ModuleDeclaration>_>
  *__range1;
  ModuleBase *target_local;
  SourceCodeOperations *this_local;
  
  __end1 = std::
           vector<soul::SourceCodeOperations::ModuleDeclaration,_std::allocator<soul::SourceCodeOperations::ModuleDeclaration>_>
           ::begin(&this->allModules);
  m = (ModuleDeclaration *)
      std::
      vector<soul::SourceCodeOperations::ModuleDeclaration,_std::allocator<soul::SourceCodeOperations::ModuleDeclaration>_>
      ::end(&this->allModules);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<soul::SourceCodeOperations::ModuleDeclaration_*,_std::vector<soul::SourceCodeOperations::ModuleDeclaration,_std::allocator<soul::SourceCodeOperations::ModuleDeclaration>_>_>
                                *)&m);
    if (!bVar1) {
      throwInternalCompilerError("findDeclaration",0x81);
    }
    pMVar2 = __gnu_cxx::
             __normal_iterator<soul::SourceCodeOperations::ModuleDeclaration_*,_std::vector<soul::SourceCodeOperations::ModuleDeclaration,_std::allocator<soul::SourceCodeOperations::ModuleDeclaration>_>_>
             ::operator*(&__end1);
    if (pMVar2->module == target) break;
    __gnu_cxx::
    __normal_iterator<soul::SourceCodeOperations::ModuleDeclaration_*,_std::vector<soul::SourceCodeOperations::ModuleDeclaration,_std::allocator<soul::SourceCodeOperations::ModuleDeclaration>_>_>
    ::operator++(&__end1);
  }
  return pMVar2;
}

Assistant:

SourceCodeOperations::ModuleDeclaration* SourceCodeOperations::findDeclaration (AST::ModuleBase& target)
{
    for (auto& m : allModules)
        if (std::addressof (m.module) == std::addressof (target))
            return std::addressof (m);

    SOUL_ASSERT_FALSE;
    return {};
}